

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas.cpp
# Opt level: O2

bool nullcInitCanvasModule(void)

{
  nullres nVar1;
  
  nVar1 = nullcBindModuleFunctionHelper<void,float,float,float,NULLCCanvas::Canvas*>
                    ("img.canvas",NULLCCanvas::CanvasClearRGB,"Canvas::Clear",0);
  if (nVar1 == '\0') {
    return false;
  }
  nVar1 = nullcBindModuleFunctionHelper<void,float,float,float,float,NULLCCanvas::Canvas*>
                    ("img.canvas",NULLCCanvas::CanvasClearRGBA,"Canvas::Clear",1);
  if (nVar1 != '\0') {
    nVar1 = nullcBindModuleFunctionHelper<void,unsigned_char,unsigned_char,unsigned_char,NULLCCanvas::Canvas*>
                      ("img.canvas",NULLCCanvas::CanvasSetColor,"Canvas::SetColor",0);
    if (nVar1 == '\0') {
      return false;
    }
    nVar1 = nullcBindModuleFunctionHelper<void,bool,NULLCCanvas::Canvas*>
                      ("img.canvas",NULLCCanvas::CanvasSetAA,"Canvas::SetAA",0);
    if (nVar1 == '\0') {
      return false;
    }
    nVar1 = nullcBindModuleFunctionHelper<void,double,double,NULLCCanvas::Canvas*>
                      ("img.canvas",NULLCCanvas::CanvasDrawPoint,"Canvas::DrawPoint",0);
    if (nVar1 == '\0') {
      return false;
    }
    nVar1 = nullcBindModuleFunctionHelper<void,double,double,double,NULLCCanvas::Canvas*>
                      ("img.canvas",NULLCCanvas::CanvasDrawPointA,"Canvas::DrawPoint",1);
    if (nVar1 != '\0') {
      nVar1 = nullcBindModuleFunctionHelper<void,double,double,double,double,NULLCCanvas::Canvas*>
                        ("img.canvas",NULLCCanvas::CanvasDrawLine,"Canvas::DrawLine",0);
      if (nVar1 == '\0') {
        return false;
      }
      nVar1 = nullcBindModuleFunctionHelper<void,int,int,int,int,NULLCCanvas::Canvas*>
                        ("img.canvas",NULLCCanvas::CanvasDrawRect,"Canvas::DrawRect",0);
      if (nVar1 == '\0') {
        return false;
      }
      nVar1 = nullcBindModuleFunctionHelper<void,int,int,int,int,double,NULLCCanvas::Canvas*>
                        ("img.canvas",NULLCCanvas::CanvasDrawRectA,"Canvas::DrawRect",1);
      return nVar1 != '\0';
    }
  }
  return false;
}

Assistant:

bool	nullcInitCanvasModule()
{
	REGISTER_FUNC(CanvasClearRGB, "Canvas::Clear", 0);
	REGISTER_FUNC(CanvasClearRGBA, "Canvas::Clear", 1);
	REGISTER_FUNC(CanvasSetColor, "Canvas::SetColor", 0);
	REGISTER_FUNC(CanvasSetAA, "Canvas::SetAA", 0);
	REGISTER_FUNC(CanvasDrawPoint, "Canvas::DrawPoint", 0);
	REGISTER_FUNC(CanvasDrawPointA, "Canvas::DrawPoint", 1);
	REGISTER_FUNC(CanvasDrawLine, "Canvas::DrawLine", 0);
	REGISTER_FUNC(CanvasDrawRect, "Canvas::DrawRect", 0);
	REGISTER_FUNC(CanvasDrawRectA, "Canvas::DrawRect", 1);

	return true;
}